

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O0

Unique<anurbs::Entry<anurbs::BrepLoop>_> __thiscall
anurbs::
new_<anurbs::Entry<anurbs::BrepLoop>,std::__cxx11::string&,std::shared_ptr<anurbs::BrepLoop>&,std::shared_ptr<anurbs::Attributes>&>
          (anurbs *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          shared_ptr<anurbs::BrepLoop> *args_1,shared_ptr<anurbs::Attributes> *args_2)

{
  shared_ptr<anurbs::BrepLoop> *key;
  Entry<anurbs::BrepLoop> *this_00;
  shared_ptr<anurbs::Attributes> local_48;
  shared_ptr<anurbs::BrepLoop> local_38;
  shared_ptr<anurbs::Attributes> *local_28;
  shared_ptr<anurbs::Attributes> *args_local_2;
  shared_ptr<anurbs::BrepLoop> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_28 = args_2;
  args_local_2 = (shared_ptr<anurbs::Attributes> *)args_1;
  args_local_1 = (shared_ptr<anurbs::BrepLoop> *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = (Entry<anurbs::BrepLoop> *)operator_new(0x48);
  key = args_local_1;
  std::shared_ptr<anurbs::BrepLoop>::shared_ptr
            (&local_38,(shared_ptr<anurbs::BrepLoop> *)args_local_2);
  std::shared_ptr<anurbs::Attributes>::shared_ptr(&local_48,local_28);
  Entry<anurbs::BrepLoop>::Entry(this_00,(string *)key,&local_38,&local_48);
  std::
  unique_ptr<anurbs::Entry<anurbs::BrepLoop>,std::default_delete<anurbs::Entry<anurbs::BrepLoop>>>::
  unique_ptr<std::default_delete<anurbs::Entry<anurbs::BrepLoop>>,void>
            ((unique_ptr<anurbs::Entry<anurbs::BrepLoop>,std::default_delete<anurbs::Entry<anurbs::BrepLoop>>>
              *)this,this_00);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr(&local_48);
  std::shared_ptr<anurbs::BrepLoop>::~shared_ptr(&local_38);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::BrepLoop>,_std::default_delete<anurbs::Entry<anurbs::BrepLoop>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::BrepLoop>,_std::default_delete<anurbs::Entry<anurbs::BrepLoop>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}